

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

bool __thiscall cppcms::widgets::base_text::validate(base_text *this)

{
  bool bVar1;
  long *in_RDI;
  bool local_1;
  
  bVar1 = base_widget::valid((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)));
  if (bVar1) {
    bVar1 = base_widget::set((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)));
    if (((bVar1) || ((int)in_RDI[5] != 0)) || (*(int *)((long)in_RDI + 0x2c) != -1)) {
      if (((ulong)in_RDI[7] < (ulong)(long)(int)in_RDI[5]) ||
         ((-1 < *(int *)((long)in_RDI + 0x2c) &&
          ((ulong)(long)*(int *)((long)in_RDI + 0x2c) < (ulong)in_RDI[7])))) {
        base_widget::valid((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),false);
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
    else {
      base_widget::valid((base_widget *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),true);
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool base_text::validate()
{
	if(!valid())
		return false;
	if(!set() && low_==0 && high_==-1) {
		valid(true);
		return true;
	}
	if(code_points_ < size_t(low_) || (high_ >=0 && code_points_ > size_t(high_))) {
		valid(false);
		return false;
	}
	return true;
}